

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void serialize_model<_IO_FILE*>(IsoForest *model,_IO_FILE **out)

{
  pointer pvVar1;
  pointer pIVar2;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  pointer pvVar3;
  IsoTree *node;
  pointer node_00;
  size_t veclen;
  uint8_t data_en [5];
  size_t data_sizets [2];
  double data_doubles [2];
  long local_68;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  size_t local_58;
  long local_50;
  double local_48;
  double dStack_40;
  
  if (!interrupt_switch) {
    local_5d = (undefined1)model->new_cat_action;
    local_5c = (undefined1)model->cat_split_type;
    local_5b = (undefined1)model->missing_action;
    local_5a = model->has_range_penalty;
    local_59 = (undefined1)model->scoring_metric;
    write_bytes<unsigned_char>(&local_5d,5,out);
    local_48 = model->exp_avg_depth;
    dStack_40 = model->exp_avg_sep;
    write_bytes<double>(&local_48,2,out);
    local_58 = model->orig_sample_size;
    local_50 = ((long)(model->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    write_bytes<unsigned_long>(&local_58,2,out);
    pvVar1 = (model->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = (model->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1)
    {
      local_68 = ((long)(pvVar3->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar3->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      write_bytes<unsigned_long>(&local_68,1,out);
      pIVar2 = (pvVar3->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (pvVar3->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar2; node_00 = node_00 + 1) {
        serialize_node<_IO_FILE*>(node_00,out);
      }
    }
  }
  return;
}

Assistant:

void serialize_model(const IsoForest &model, otype &out)
{
    if (interrupt_switch) return;

    uint8_t data_en[] = {
        (uint8_t)model.new_cat_action,
        (uint8_t)model.cat_split_type,
        (uint8_t)model.missing_action,
        (uint8_t)model.has_range_penalty,
        (uint8_t)model.scoring_metric,
    };
    write_bytes<uint8_t>((void*)data_en, (size_t)5, out);

    double data_doubles[] = {
        model.exp_avg_depth,
        model.exp_avg_sep
    };
    write_bytes<double>((void*)data_doubles, (size_t)2, out);

    size_t data_sizets[] = {
        model.orig_sample_size,
        model.trees.size()
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)2, out);

    size_t veclen;
    for (const auto &tree : model.trees) {
        veclen = tree.size();
        write_bytes<size_t>((void*)&veclen, (size_t)1, out);
        for (const auto &node : tree)
            serialize_node(node, out);
    }
}